

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O2

ssize_t __thiscall
LASwriteItemCompressed_RGB14_v3::write
          (LASwriteItemCompressed_RGB14_v3 *this,int __fd,void *__buf,size_t __n)

{
  undefined4 uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  U16 *item;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  undefined4 in_register_00000034;
  ushort *puVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  uint uVar17;
  ushort uVar18;
  ushort uVar19;
  uint local_7c;
  ulong local_78;
  
  puVar11 = (ushort *)CONCAT44(in_register_00000034,__fd);
  local_78 = (ulong)this->current_context;
  item = this->contexts[local_78].last_item;
  uVar6 = *__buf;
  if ((this->current_context != uVar6) &&
     (this->current_context = uVar6, local_78 = (ulong)uVar6, this->contexts[uVar6].unused == true))
  {
    createAndInitModelsAndCompressors(this,uVar6,(U8 *)item);
    item = this->contexts[this->current_context].last_item;
    local_78 = (ulong)this->current_context;
  }
  uVar5 = *item & 0xff;
  uVar8 = *puVar11 & 0xff;
  uVar10 = *item & 0xff00;
  uVar19 = *puVar11 & 0xff00;
  uVar12 = item[1] & 0xff;
  uVar18 = puVar11[1] & 0xff;
  uVar13 = item[1] & 0xff00;
  uVar16 = puVar11[1] & 0xff00;
  uVar15 = item[2] & 0xff;
  uVar2 = puVar11[2] & 0xff;
  uVar14 = item[2] & 0xff00;
  uVar9 = puVar11[2] & 0xff00;
  uVar6 = (uint)(uVar5 != uVar8) + (uint)(uVar10 != uVar19) * 2 + (uint)(uVar12 != uVar18) * 4 +
          (uint)(uVar13 != uVar16) * 8 | (uint)(uVar15 != uVar2) << 4 |
          (uint)((uVar19 != uVar9 || uVar19 != uVar16) || (uVar8 != uVar2 || uVar8 != uVar18)) << 6
          | (uint)(uVar14 != uVar9) << 5;
  ArithmeticEncoder::encodeSymbol(this->enc_RGB,this->contexts[local_78].m_byte_used,uVar6);
  local_7c = 0;
  uVar17 = 0;
  if (uVar5 != uVar8) {
    uVar17 = (uint)(byte)*puVar11 - (uint)(byte)*item;
    ArithmeticEncoder::encodeSymbol
              (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_0,
               (uVar17 >> 0x17 & 0x100) + uVar17);
  }
  if (uVar10 != uVar19) {
    local_7c = (uint)*(byte *)((long)puVar11 + 1) - (uint)*(byte *)((long)item + 1);
    ArithmeticEncoder::encodeSymbol
              (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_1,
               (local_7c >> 0x17 & 0x100) + local_7c);
  }
  if ((uVar19 != uVar9 || uVar19 != uVar16) || (uVar8 != uVar2 || uVar8 != uVar18)) {
    if (uVar12 != uVar18) {
      uVar4 = (byte)item[1] + uVar17;
      uVar7 = uVar4 & 0xff;
      if (0xfe < (int)uVar4) {
        uVar7 = 0xff;
      }
      uVar3 = 0;
      if (0 < (int)uVar4) {
        uVar3 = uVar7;
      }
      uVar3 = (byte)puVar11[1] - uVar3;
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_2,
                 (uVar3 >> 0x17 & 0x100) + uVar3);
    }
    if (uVar15 != uVar2) {
      uVar17 = ((byte)puVar11[1] + uVar17) - (uint)(byte)item[1];
      uVar7 = (uint)(byte)item[2] +
              (int)(short)((int)((uint)(ushort)((short)uVar17 >> 0xf) << 0x10 | uVar17 & 0xffff) / 2
                          );
      uVar17 = uVar7 & 0xff;
      if (0xfe < (int)uVar7) {
        uVar17 = 0xff;
      }
      uVar4 = 0;
      if (0 < (int)uVar7) {
        uVar4 = uVar17;
      }
      uVar4 = (byte)puVar11[2] - uVar4;
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_4,
                 (uVar4 >> 0x17 & 0x100) + uVar4);
    }
    if (uVar13 != uVar16) {
      uVar7 = *(byte *)((long)item + 3) + local_7c;
      uVar17 = uVar7 & 0xff;
      if (0xfe < (int)uVar7) {
        uVar17 = 0xff;
      }
      uVar4 = 0;
      if (0 < (int)uVar7) {
        uVar4 = uVar17;
      }
      uVar4 = *(byte *)((long)puVar11 + 3) - uVar4;
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_3,
                 (uVar4 >> 0x17 & 0x100) + uVar4);
    }
    if (uVar14 != uVar9) {
      uVar17 = (*(byte *)((long)puVar11 + 3) + local_7c) - (uint)*(byte *)((long)item + 3);
      uVar7 = (uint)*(byte *)((long)item + 5) +
              (int)(short)((int)((uint)(ushort)((short)uVar17 >> 0xf) << 0x10 | uVar17 & 0xffff) / 2
                          );
      uVar17 = uVar7 & 0xff;
      if (0xfe < (int)uVar7) {
        uVar17 = 0xff;
      }
      uVar4 = 0;
      if (0 < (int)uVar7) {
        uVar4 = uVar17;
      }
      uVar4 = *(byte *)((long)puVar11 + 5) - uVar4;
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_5,
                 (uVar4 >> 0x17 & 0x100) + uVar4);
    }
  }
  if (uVar6 != 0) {
    this->changed_RGB = true;
  }
  item[2] = puVar11[2];
  uVar1 = *(undefined4 *)puVar11;
  *(undefined4 *)item = uVar1;
  return CONCAT71((uint7)(uint3)((uint)uVar1 >> 8),1);
}

Assistant:

inline BOOL LASwriteItemCompressed_RGB14_v3::write(const U8* item, U32& context)
{
  // get last

  U16* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 writer
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndCompressors(current_context, (U8*)last_item);
      last_item = contexts[current_context].last_item;
    }
  }

  // compress

  I32 diff_l = 0;
  I32 diff_h = 0;
  I32 corr;
  U32 sym = ((last_item[0]&0x00FF) != (((const U16*)item)[0]&0x00FF)) << 0;
  sym |= ((last_item[0]&0xFF00) != (((const U16*)item)[0]&0xFF00)) << 1;
  sym |= ((last_item[1]&0x00FF) != (((const U16*)item)[1]&0x00FF)) << 2;
  sym |= ((last_item[1]&0xFF00) != (((const U16*)item)[1]&0xFF00)) << 3;
  sym |= ((last_item[2]&0x00FF) != (((const U16*)item)[2]&0x00FF)) << 4;
  sym |= ((last_item[2]&0xFF00) != (((const U16*)item)[2]&0xFF00)) << 5;
  sym |= (((((const U16*)item)[0]&0x00FF) != (((const U16*)item)[1]&0x00FF)) || ((((const U16*)item)[0]&0x00FF) != (((const U16*)item)[2]&0x00FF)) || ((((const U16*)item)[0]&0xFF00) != (((const U16*)item)[1]&0xFF00)) || ((((const U16*)item)[0]&0xFF00) != (((const U16*)item)[2]&0xFF00))) << 6;
  enc_RGB->encodeSymbol(contexts[current_context].m_byte_used, sym);
  if (sym & (1 << 0))
  {
    diff_l = ((int)(((const U16*)item)[0]&255)) - (last_item[0]&255);
    enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_0, U8_FOLD(diff_l));
  }
  if (sym & (1 << 1))
  {
    diff_h = ((int)(((const U16*)item)[0]>>8)) - (last_item[0]>>8);
    enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_1, U8_FOLD(diff_h));
  }
  if (sym & (1 << 6))
  {
    if (sym & (1 << 2))
    {
      corr = ((int)(((const U16*)item)[1]&255)) - U8_CLAMP(diff_l + (last_item[1]&255));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_2, U8_FOLD(corr));
    }
    if (sym & (1 << 4))
    {
      diff_l = (diff_l + (((const U16*)item)[1]&255) - (last_item[1]&255)) / 2;
      corr = ((int)(((const U16*)item)[2]&255)) - U8_CLAMP(diff_l + (last_item[2]&255));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_4, U8_FOLD(corr));
    }
    if (sym & (1 << 3))
    {
      corr = ((int)(((const U16*)item)[1]>>8)) - U8_CLAMP(diff_h + (last_item[1]>>8));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_3, U8_FOLD(corr));
    }
    if (sym & (1 << 5))
    {
      diff_h = (diff_h + (((const U16*)item)[1]>>8) - (last_item[1]>>8)) / 2;
      corr = ((int)(((const U16*)item)[2]>>8)) - U8_CLAMP(diff_h + (last_item[2]>>8));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_5, U8_FOLD(corr));
    }
  }
  if (sym)
  {
    changed_RGB = TRUE;
  }
  memcpy(last_item, item, 6);

  return TRUE;
}